

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

command_node * __thiscall
libchars::command_node::add_node
          (command_node *this,command_node *parent,string *part,filter_t mask_,bool hidden_)

{
  command_node *this_00;
  command_node *this_01;
  
  if ((parent != (command_node *)0x0) &&
     (this_00 = (command_node *)operator_new(0x58,(nothrow_t *)&std::nothrow),
     this_00 != (command_node *)0x0)) {
    this_01 = this_00;
    command_node(this_00,part);
    this_00->mask = mask_;
    this_00->hidden = hidden_;
    add_node(this_01,parent,this_00);
    return this_00;
  }
  return (command_node *)0x0;
}

Assistant:

command_node *command_node::add_node(command_node *parent, const std::string &part, command::filter_t mask_, bool hidden_)
    {
        if (parent != NULL) {
            command_node *n = new (std::nothrow) command_node(part);
            if (n != NULL) {
                n->mask = mask_;
                n->hidden = hidden_;
                add_node(parent, n);
            }
            return n;
        }
        else {
            return NULL;
        }
    }